

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O3

void av1_find_best_ref_mvs
               (int allow_hp,int_mv *mvlist,int_mv *nearest_mv,int_mv *near_mv,int is_integer)

{
  bool bVar1;
  bool bVar2;
  ushort uVar3;
  long lVar4;
  short sVar5;
  ushort uVar6;
  
  lVar4 = 0;
  bVar2 = true;
  do {
    if (is_integer == 0) {
      if (allow_hp == 0) {
        uVar6 = mvlist[lVar4].as_mv.row;
        if ((uVar6 & 1) != 0) {
          mvlist[lVar4].as_mv.row = uVar6 + (ushort)((short)uVar6 < 1) * 2 + -1;
        }
        uVar6 = *(ushort *)((long)mvlist + lVar4 * 4 + 2);
        if ((uVar6 & 1) != 0) {
          sVar5 = uVar6 + (ushort)((short)uVar6 < 1) * 2 + -1;
          goto LAB_0039df32;
        }
      }
    }
    else {
      uVar6 = mvlist[lVar4].as_mv.row % 8;
      if (uVar6 != 0) {
        sVar5 = mvlist[lVar4].as_mv.row - uVar6;
        mvlist[lVar4].as_mv.row = sVar5;
        uVar3 = -uVar6;
        if (0 < (short)uVar6) {
          uVar3 = uVar6;
        }
        if (4 < uVar3) {
          mvlist[lVar4].as_mv.row = sVar5 + (ushort)(0 < (short)uVar6) * 0x10 + -8;
        }
      }
      sVar5 = *(short *)((long)mvlist + lVar4 * 4 + 2);
      uVar6 = sVar5 % 8;
      if (uVar6 != 0) {
        sVar5 = sVar5 - uVar6;
        *(short *)((long)mvlist + lVar4 * 4 + 2) = sVar5;
        uVar3 = -uVar6;
        if (0 < (short)uVar6) {
          uVar3 = uVar6;
        }
        if (4 < uVar3) {
          sVar5 = sVar5 + (ushort)(0 < (short)uVar6) * 0x10 + -8;
LAB_0039df32:
          *(short *)((long)mvlist + lVar4 * 4 + 2) = sVar5;
        }
      }
    }
    lVar4 = 1;
    bVar1 = !bVar2;
    bVar2 = false;
    if (bVar1) {
      *nearest_mv = *mvlist;
      *near_mv = mvlist[1];
      return;
    }
  } while( true );
}

Assistant:

void av1_find_best_ref_mvs(int allow_hp, int_mv *mvlist, int_mv *nearest_mv,
                           int_mv *near_mv, int is_integer) {
  int i;
  // Make sure all the candidates are properly clamped etc
  for (i = 0; i < MAX_MV_REF_CANDIDATES; ++i) {
    lower_mv_precision(&mvlist[i].as_mv, allow_hp, is_integer);
  }
  *nearest_mv = mvlist[0];
  *near_mv = mvlist[1];
}